

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

lu_int basiclu_obj_factorize(basiclu_object *obj,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  lu_int lVar1;
  basiclu_object *in_RDI;
  basiclu_object *in_R8;
  lu_int status;
  double *in_stack_00000258;
  lu_int *in_stack_00000260;
  double *in_stack_00000268;
  lu_int *in_stack_00000270;
  double *in_stack_00000278;
  lu_int *in_stack_00000280;
  lu_int *in_stack_000002a0;
  double *in_stack_000002a8;
  lu_int *in_stack_000002b0;
  lu_int *in_stack_000002b8;
  lu_int *in_stack_000002c0;
  double *in_stack_000002c8;
  lu_int in_stack_000002d0;
  basiclu_object *obj_00;
  int local_54;
  lu_int local_24;
  
  lVar1 = isvalid(in_RDI);
  if (lVar1 == 0) {
    local_24 = -8;
  }
  else {
    obj_00 = in_R8;
    local_54 = basiclu_factorize(in_stack_00000280,in_stack_00000278,in_stack_00000270,
                                 in_stack_00000268,in_stack_00000260,in_stack_00000258,
                                 in_stack_000002a0,in_stack_000002a8,in_stack_000002b0,
                                 in_stack_000002b8,in_stack_000002c0,in_stack_000002c8,
                                 in_stack_000002d0);
    while ((local_54 == 1 && (local_54 = lu_realloc_obj(obj_00), local_54 == 0))) {
      obj_00 = in_R8;
      local_54 = basiclu_factorize(in_stack_00000280,in_stack_00000278,in_stack_00000270,
                                   in_stack_00000268,in_stack_00000260,in_stack_00000258,
                                   in_stack_000002a0,in_stack_000002a8,in_stack_000002b0,
                                   in_stack_000002b8,in_stack_000002c0,in_stack_000002c8,
                                   in_stack_000002d0);
    }
    local_24 = local_54;
  }
  return local_24;
}

Assistant:

lu_int basiclu_obj_factorize(struct basiclu_object *obj, const lu_int *Bbegin,
                             const lu_int *Bend, const lu_int *Bi,
                             const double *Bx)
{
    lu_int status;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    status = basiclu_factorize(obj->istore, obj->xstore, obj->Li, obj->Lx,
                               obj->Ui, obj->Ux, obj->Wi, obj->Wx, Bbegin, Bend,
                               Bi, Bx, 0);

    while (status == BASICLU_REALLOCATE)
    {
        status = lu_realloc_obj(obj);
        if (status != BASICLU_OK)
            break;
        status = basiclu_factorize(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                   obj->Ui, obj->Ux, obj->Wi, obj->Wx, Bbegin,
                                   Bend, Bi, Bx, 1);
    }

    return status;
}